

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry.cpp
# Opt level: O0

void __thiscall SoapySDR::Registry::~Registry(Registry *this)

{
  ulong uVar1;
  FunctionTable *this_00;
  string *in_RDI;
  key_type *in_stack_ffffffffffffffd8;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = getFunctionTable_abi_cxx11_();
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionsEntry>_>_>
    ::erase(this_00,in_stack_ffffffffffffffd8);
  }
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

SoapySDR::Registry::~Registry(void)
{
    //erase entry
    if (_name.empty()) return;
    getFunctionTable().erase(_name);
}